

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.cpp
# Opt level: O0

void Allocations::forgetArea(int64_t fileID,int64_t position,int64_t space)

{
  bool bVar1;
  pointer ppVar2;
  bool bVar3;
  _Self local_40;
  _Self local_38;
  iterator it;
  Key key;
  int64_t space_local;
  int64_t position_local;
  int64_t fileID_local;
  
  it._M_node = (_Base_ptr)fileID;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
       ::find(&allocations,(key_type *)&it);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
       ::end(&allocations);
  bVar1 = std::operator!=(&local_38,&local_40);
  bVar3 = false;
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::Usage>_>::
             operator->(&local_38);
    bVar3 = (ppVar2->second).space == space;
  }
  if (bVar3) {
    std::
    map<Allocations::Key,Allocations::Usage,std::less<Allocations::Key>,std::allocator<std::pair<Allocations::Key_const,Allocations::Usage>>>
    ::erase_abi_cxx11_((map<Allocations::Key,Allocations::Usage,std::less<Allocations::Key>,std::allocator<std::pair<Allocations::Key_const,Allocations::Usage>>>
                        *)&allocations,(iterator)local_38._M_node);
  }
  std::
  multimap<Allocations::Key,_Allocations::SubArea,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::SubArea>_>_>
  ::erase(&subAreas,(key_type *)&it);
  return;
}

Assistant:

void Allocations::forgetArea(int64_t fileID, int64_t position, int64_t space)
{
	Key key{ fileID, position };
	auto it = allocations.find(key);
	if (it != allocations.end() && it->second.space == space)
		allocations.erase(it);

	subAreas.erase(key);
}